

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStringConst
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,StringConst *curr
          )

{
  string local_58;
  Literal local_38;
  StringConst *local_20;
  StringConst *curr_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  
  local_20 = curr;
  curr_local = (StringConst *)this;
  this_local = (ExpressionRunner<wasm::ModuleRunner> *)__return_storage_ptr__;
  IString::toString_abi_cxx11_(&local_58,&(curr->string).super_IString);
  ::wasm::Literal::Literal(&local_38,&local_58);
  Flow::Flow(__return_storage_ptr__,&local_38);
  ::wasm::Literal::~Literal(&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

Flow visitStringConst(StringConst* curr) {
    return Literal(curr->string.toString());
  }